

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O2

int linux_kevent_copyout(kqueue *kq,int nready,kevent *el,int nevents)

{
  long *plVar1;
  knote *kn;
  uint uVar2;
  long lVar3;
  filter *filt;
  kevent *pkVar4;
  int iVar5;
  knote *kn_00;
  epoll_event *ev;
  kevent *el_00;
  ulong uVar6;
  bool bVar7;
  
  pkVar4 = el + nevents;
  lVar3 = __tls_get_addr(&PTR_0010afd0);
  ev = (epoll_event *)(lVar3 + 0x1930);
  if (nready < 1) {
    nready = 0;
  }
  uVar6 = (ulong)(uint)nready;
  el_00 = el;
  while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
    plVar1 = (long *)(ev->data).ptr;
    if (plVar1 != (long *)0x0) {
      iVar5 = (int)plVar1[1];
      if (iVar5 == 3) {
        iVar5 = (int)((ulong)((long)pkVar4 - (long)el_00) >> 5);
        filt = *(filter **)(*plVar1 + 8);
        kn_00 = (knote *)0x0;
      }
      else if (iVar5 == 2) {
        kn = *(knote **)(*plVar1 + 0x28);
        kn_00 = *(knote **)(*plVar1 + 0x30);
        if ((kn != (knote *)0x0) && ((ev->events & 0x2019) != 0)) {
          if ((pkVar4 <= el_00) ||
             (uVar2 = linux_kevent_copyout_ev
                                (el_00,(int)((ulong)((long)pkVar4 - (long)el_00) >> 5),ev,
                                 kn->kn_kq->kq_filt + ~(long)(kn->kev).filter,kn), (int)uVar2 < 0))
          break;
          el_00 = el_00 + uVar2;
        }
        if ((kn_00 == (knote *)0x0) || ((ev->events & 0x1c) == 0)) goto LAB_0010465a;
        if (pkVar4 <= el_00) break;
        iVar5 = (int)((ulong)((long)pkVar4 - (long)el_00) >> 5);
        filt = kn_00->kn_kq->kq_filt + ~(long)(kn_00->kev).filter;
      }
      else {
        if (iVar5 != 1) {
          return -1;
        }
        if (pkVar4 <= el_00) break;
        kn_00 = (knote *)*plVar1;
        iVar5 = (int)((ulong)((long)pkVar4 - (long)el_00) >> 5);
        filt = kn_00->kn_kq->kq_filt + ~(long)(kn_00->kev).filter;
      }
      uVar2 = linux_kevent_copyout_ev(el_00,iVar5,ev,filt,kn_00);
      if ((int)uVar2 < 0) break;
      el_00 = el_00 + uVar2;
    }
LAB_0010465a:
    ev = ev + 1;
  }
  return (int)((ulong)((long)el_00 - (long)el) >> 5);
}

Assistant:

int
linux_kevent_copyout(struct kqueue *kq, int nready, struct kevent *el, int nevents)
{
    struct kevent   *el_p = el, *el_end = el + nevents;
    int             i;

    dbg_printf("got %i events from epoll", nready);

    for (i = 0; i < nready; i++) {
        struct epoll_event    *ev = &epoll_events[i];    /* Thread local storage populated in linux_kevent_wait */
        struct epoll_udata    *epoll_udata = ev->data.ptr;
        int                   rv;

        if (!epoll_udata) {
            dbg_puts("event has no knote, skipping..."); /* Forgot to call KN_UDATA()? */
            continue;
        }

        dbg_printf("[%i] %s", i, epoll_event_dump(ev));

        /*
         * epoll event is associated with a single filter
         * so we just have one knote per event.
         *
         * As different filters store pointers to different
         * structures, we need to examine ud_type to figure
         * out what epoll_data contains.
         */
        switch (epoll_udata->ud_type) {
        case EPOLL_UDATA_KNOTE:
        {
            struct knote *kn = epoll_udata->ud_kn;

            assert(kn);
            if (el_p >= el_end) {
            oos:
                dbg_printf("no more available kevent slots, used %zu", el_p - el);
                goto done;
            }

            rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, knote_get_filter(kn), kn);
            if (rv < 0) goto done;
            el_p += rv;
        }
            break;

        /*
         * epoll event is associated with one filter for
         * reading and one filter for writing.
         */
        case EPOLL_UDATA_FD_STATE:
        {
            struct fd_state   *fds = epoll_udata->ud_fds;
            struct knote      *kn, *write;
            assert(fds);

            /*
             * fds can be freed after the first linux_kevent_copyout_ev
             * so cache the pointer value here.
             */
            write = fds->fds_write;

            /*
             *    FD, or errored, or other side shutdown
             */
            if ((kn = fds->fds_read) && (ev->events & (EPOLLIN | EPOLLHUP | EPOLLRDHUP | EPOLLERR))) {
                if (el_p >= el_end) goto oos;

                rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, knote_get_filter(kn), kn);
                if (rv < 0) goto done;
                el_p += rv;
            }

            /*
             *    FD is writable, or errored, or other side shutdown
             */
            if ((kn = write) && (ev->events & (EPOLLOUT | POLLHUP | EPOLLERR))) {
                if (el_p >= el_end) goto oos;

                rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, knote_get_filter(kn), kn);
                if (rv < 0) goto done;
                el_p += rv;
            }
        }
            break;

        case EPOLL_UDATA_EVENT_FD:
        {
            struct eventfd    *efd = epoll_udata->ud_efd;

            assert(efd);

            rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, efd->ef_filt, NULL);
            if (rv < 0) goto done;
            el_p += rv;
            break;
        }

        /*
         *    Bad udata value. Maybe use after free?
         */
        default:
            assert(0);
            return (-1);
        }
    }

done:
    return el_p - el;
}